

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void Curl_http_resp_free(http_resp *resp)

{
  if (resp != (http_resp *)0x0) {
    (*Curl_cfree)(resp->description);
    Curl_dynhds_free(&resp->headers);
    Curl_dynhds_free(&resp->trailers);
    if (resp->prev != (http_resp *)0x0) {
      Curl_http_resp_free(resp->prev);
    }
    (*Curl_cfree)(resp);
    return;
  }
  return;
}

Assistant:

void Curl_http_resp_free(struct http_resp *resp)
{
  if(resp) {
    free(resp->description);
    Curl_dynhds_free(&resp->headers);
    Curl_dynhds_free(&resp->trailers);
    if(resp->prev)
      Curl_http_resp_free(resp->prev);
    free(resp);
  }
}